

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio_lib.c
# Opt level: O0

int BIO_read(BIO *b,void *data,int len)

{
  int iVar1;
  int ret;
  size_t readbytes;
  int local_28;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (len < 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = bio_read_intern((BIO *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),b,
                            (size_t)data,(size_t *)CONCAT44(len,in_stack_ffffffffffffffe0));
    if (0 < iVar1) {
      iVar1 = local_28;
    }
  }
  return iVar1;
}

Assistant:

int BIO_read(BIO *b, void *data, int dlen)
{
    size_t readbytes;
    int ret;

    if (dlen < 0)
        return 0;

    ret = bio_read_intern(b, data, (size_t)dlen, &readbytes);

    if (ret > 0) {
        /* *readbytes should always be <= dlen */
        ret = (int)readbytes;
    }

    return ret;
}